

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_cnv.cpp
# Opt level: O0

void ucnv_toUWriteCodePoint_63
               (UConverter *cnv,UChar32 c,UChar **target,UChar *targetLimit,int32_t **offsets,
               int32_t sourceIndex,UErrorCode *pErrorCode)

{
  UChar *pUVar1;
  int32_t *piVar2;
  UChar *pUVar3;
  int8_t local_49;
  int32_t *piStack_48;
  int8_t i;
  int32_t *o;
  UChar *t;
  int32_t sourceIndex_local;
  int32_t **offsets_local;
  UChar *targetLimit_local;
  UChar **target_local;
  UChar32 c_local;
  UConverter *cnv_local;
  
  pUVar1 = *target;
  o = (int32_t *)pUVar1;
  target_local._4_4_ = c;
  if (pUVar1 < targetLimit) {
    if (c < 0x10000) {
      *pUVar1 = (UChar)c;
      target_local._4_4_ = 0xffffffff;
      o = (int32_t *)(pUVar1 + 1);
    }
    else {
      pUVar3 = pUVar1 + 1;
      *pUVar1 = (short)(c >> 10) + L'ퟀ';
      target_local._4_4_ = c & 0x3ffU | 0xdc00;
      o = (int32_t *)pUVar3;
      if (pUVar3 < targetLimit) {
        o = (int32_t *)(pUVar1 + 2);
        *pUVar3 = (UChar)target_local._4_4_;
        target_local._4_4_ = 0xffffffff;
      }
    }
    if ((offsets != (int32_t **)0x0) && (piVar2 = *offsets, piVar2 != (int32_t *)0x0)) {
      *piVar2 = sourceIndex;
      piStack_48 = piVar2 + 1;
      if (*target + 1 < o) {
        piStack_48 = piVar2 + 2;
        piVar2[1] = sourceIndex;
      }
      *offsets = piStack_48;
    }
  }
  *target = (UChar *)o;
  if (-1 < (int)target_local._4_4_) {
    if (cnv != (UConverter *)0x0) {
      if (target_local._4_4_ < 0x10000) {
        local_49 = '\x01';
        cnv->UCharErrorBuffer[0] = (UChar)target_local._4_4_;
      }
      else {
        cnv->UCharErrorBuffer[0] = (short)((int)target_local._4_4_ >> 10) + L'ퟀ';
        local_49 = '\x02';
        cnv->UCharErrorBuffer[1] = (UChar)target_local._4_4_ & 0x3ffU | 0xdc00;
      }
      cnv->UCharErrorBufferLength = local_49;
    }
    *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
  }
  return;
}

Assistant:

U_CFUNC void
ucnv_toUWriteCodePoint(UConverter *cnv,
                       UChar32 c,
                       UChar **target, const UChar *targetLimit,
                       int32_t **offsets,
                       int32_t sourceIndex,
                       UErrorCode *pErrorCode) {
    UChar *t;
    int32_t *o;

    t=*target;

    if(t<targetLimit) {
        if(c<=0xffff) {
            *t++=(UChar)c;
            c=U_SENTINEL;
        } else /* c is a supplementary code point */ {
            *t++=U16_LEAD(c);
            c=U16_TRAIL(c);
            if(t<targetLimit) {
                *t++=(UChar)c;
                c=U_SENTINEL;
            }
        }

        /* write offsets */
        if(offsets!=NULL && (o=*offsets)!=NULL) {
            *o++=sourceIndex;
            if((*target+1)<t) {
                *o++=sourceIndex;
            }
            *offsets=o;
        }
    }

    *target=t;

    /* write overflow from c */
    if(c>=0) {
        if(cnv!=NULL) {
            int8_t i=0;
            U16_APPEND_UNSAFE(cnv->UCharErrorBuffer, i, c);
            cnv->UCharErrorBufferLength=i;
        }
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
    }
}